

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_api.h
# Opt level: O2

char * tvm::runtime::DeviceName(int type)

{
  uint uVar1;
  char *pcVar2;
  ostream *this;
  LogMessageFatal LStack_198;
  
  uVar1 = type - 1;
  if ((uVar1 < 0xc) && ((0xffbU >> (uVar1 & 0x1f) & 1) != 0)) {
    pcVar2 = &DAT_0012edc0 + *(int *)(&DAT_0012edc0 + (ulong)uVar1 * 4);
  }
  else {
    dmlc::LogMessageFatal::LogMessageFatal
              (&LStack_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/device_api.h"
               ,0xe6);
    this = std::operator<<((ostream *)&LStack_198,"unknown type =");
    std::ostream::operator<<(this,type);
    dmlc::LogMessageFatal::~LogMessageFatal(&LStack_198);
    pcVar2 = "Unknown";
  }
  return pcVar2;
}

Assistant:

inline const char *DeviceName(int type) {
  switch (type) {
  case kDLCPU:
    return "cpu";
  case kDLGPU:
    return "gpu";
  case kDLOpenCL:
    return "opencl";
  case kDLSDAccel:
    return "sdaccel";
  case kDLAOCL:
    return "aocl";
  case kDLVulkan:
    return "vulkan";
  case kDLMetal:
    return "metal";
  case kDLVPI:
    return "vpi";
  case kDLROCM:
    return "rocm";
  case kOpenGL:
    return "opengl";
  case kDLExtDev:
    return "ext_dev";
  default:
    LOG(FATAL) << "unknown type =" << type;
    return "Unknown";
  }
}